

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O1

bool __thiscall HSet::debug(HSet *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  FILE *pFVar9;
  ulong uVar10;
  uint uVar11;
  
  if (this->setup_ == false) {
    if (this->output_flag_ == true) {
      fwrite("HSet: ERROR setup_ not called\n",0x1e,1,(FILE *)this->log_file_);
    }
  }
  else {
    uVar5 = (ulong)(uint)this->max_entry_;
    if (this->max_entry_ < 0) {
      if (this->output_flag_ == true) {
        pFVar9 = (FILE *)this->log_file_;
        pcVar8 = "HSet: ERROR max_entry_ = %d < %d\n";
        uVar3 = 0;
LAB_00387c4c:
        fprintf(pFVar9,pcVar8,uVar5,uVar3);
        print(this);
        return false;
      }
    }
    else {
      uVar5 = (ulong)((long)(this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      uVar3 = (ulong)(uint)this->count_;
      if ((int)uVar5 < this->count_) {
        if (this->output_flag_ == true) {
          pFVar9 = (FILE *)this->log_file_;
          pcVar8 = "HSet: ERROR entry_.size() = %d is less than count_ = %d\n";
          goto LAB_00387c4c;
        }
      }
      else {
        uVar11 = (uint)this->max_entry_ >> 0x1f;
        if (this->max_entry_ < 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          uVar5 = 0;
          do {
            uVar1 = (this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
            uVar3 = (ulong)uVar1;
            if (uVar3 == 0xffffffff) {
              bVar4 = false;
            }
            else {
              uVar10 = (ulong)(uint)this->count_;
              if ((int)uVar1 < 0 || this->count_ <= (int)uVar1) {
                bVar4 = true;
                if (this->output_flag_ == true) {
                  pFVar9 = (FILE *)this->log_file_;
                  pcVar8 = "HSet: ERROR pointer_[%d] = %d is not in [0, %d]\n";
                  uVar6 = uVar5 & 0xffffffff;
                  goto LAB_00387cee;
                }
              }
              else {
                uVar7 = uVar7 + 1;
                uVar2 = (this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3];
                bVar4 = false;
                if ((uVar5 != uVar2) && (bVar4 = true, this->output_flag_ == true)) {
                  pFVar9 = (FILE *)this->log_file_;
                  pcVar8 = "HSet: ERROR entry_[%d] is %d, not %d\n";
                  uVar6 = (ulong)uVar1;
                  uVar3 = (ulong)uVar2;
                  uVar10 = uVar5 & 0xffffffff;
LAB_00387cee:
                  fprintf(pFVar9,pcVar8,uVar6,uVar3,uVar10);
                  print(this);
                  bVar4 = true;
                }
              }
            }
            if (bVar4) break;
            uVar11 = (uint)((long)this->max_entry_ <= (long)uVar5);
            bVar4 = (long)uVar5 < (long)this->max_entry_;
            uVar5 = uVar5 + 1;
          } while (bVar4);
        }
        if (uVar11 != 0) {
          uVar11 = this->count_;
          uVar3 = (ulong)uVar11;
          if (uVar7 == uVar11) {
            return uVar7 == uVar11;
          }
          if (this->output_flag_ == true) {
            pFVar9 = (FILE *)this->log_file_;
            pcVar8 = "HSet: ERROR pointer_ has %d pointers, not %d\n";
            uVar5 = (ulong)uVar7;
            goto LAB_00387c4c;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool HSet::debug() const {
  if (!setup_) {
    if (output_flag_) fprintf(log_file_, "HSet: ERROR setup_ not called\n");
    if (allow_assert_) assert(setup_);
    return false;
  }
  bool max_entry_ok = max_entry_ >= min_entry;
  if (!max_entry_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR max_entry_ = %" HIGHSINT_FORMAT
              " < %" HIGHSINT_FORMAT "\n",
              max_entry_, min_entry);
      print();
    }
    if (allow_assert_) assert(max_entry_ok);
    return false;
  }
  HighsInt size = entry_.size();
  bool size_count_ok = size >= count_;
  if (!size_count_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR entry_.size() = %" HIGHSINT_FORMAT
              " is less than count_ = %" HIGHSINT_FORMAT "\n",
              size, count_);
      print();
    }
    if (allow_assert_) assert(size_count_ok);
    return false;
  }
  // Check pointer_ is consistent with count_ and entry_
  HighsInt count = 0;
  for (HighsInt ix = 0; ix <= max_entry_; ix++) {
    HighsInt pointer = pointer_[ix];
    if (pointer == no_pointer) continue;
    bool pointer_ok = pointer >= 0 && pointer < count_;
    if (!pointer_ok) {
      if (output_flag_) {
        fprintf(log_file_,
                "HSet: ERROR pointer_[%" HIGHSINT_FORMAT "] = %" HIGHSINT_FORMAT
                " is not in [0, %" HIGHSINT_FORMAT "]\n",
                ix, pointer, count_);
        print();
      }
      if (allow_assert_) assert(pointer_ok);
      return false;
    }
    count++;
    HighsInt entry = entry_[pointer];
    bool entry_ok = entry == ix;
    if (!entry_ok) {
      if (output_flag_) {
        fprintf(log_file_,
                "HSet: ERROR entry_[%" HIGHSINT_FORMAT "] is %" HIGHSINT_FORMAT
                ", not %" HIGHSINT_FORMAT "\n",
                pointer, entry, ix);
        print();
      }
      if (allow_assert_) assert(entry_ok);
      return false;
    }
  }
  bool count_ok = count == count_;
  if (!count_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR pointer_ has %" HIGHSINT_FORMAT
              " pointers, not %" HIGHSINT_FORMAT "\n",
              count, count_);
      print();
    }
    if (allow_assert_) assert(count_ok);
    return false;
  }
  return true;
}